

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

CompileData * __thiscall
anon_unknown.dwarf_73daba::Target::BuildCompileData
          (CompileData *__return_storage_ptr__,Target *this,cmSourceFile *sf)

{
  cmListFileBacktrace *this_00;
  pointer *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  cmGeneratorTarget *headTarget;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  cmLocalGenerator *localGenerator;
  string *psVar5;
  char *expression;
  const_iterator __first;
  const_iterator __last;
  iterator __first_00;
  iterator __last_00;
  const_iterator __first_01;
  const_iterator __last_01;
  undefined1 local_350 [8];
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defines;
  char *config_defs;
  undefined1 local_2f8 [8];
  string defPropName;
  char *defs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileDefines;
  undefined1 local_298 [8];
  string COMPILE_DEFINITIONS;
  __normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
  local_260;
  const_iterator local_258;
  bool local_249;
  reference pbStack_248;
  bool isSystemInclude;
  string *include;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *evaluatedIncludes;
  char *cincludes;
  undefined1 local_210 [8];
  string INCLUDE_DIRECTORIES;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  undefined1 local_1c8 [8];
  string flags_1;
  char *coptions;
  undefined1 local_198 [8];
  string COMPILE_OPTIONS;
  undefined1 local_160 [8];
  string flags;
  char *cflags;
  undefined1 local_130 [8];
  string COMPILE_FLAGS;
  string local_f0;
  undefined1 local_d0 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  cmLocalGenerator *lg;
  CompileData *cd;
  string local_48;
  byte local_21;
  cmSourceFile *local_20;
  cmSourceFile *sf_local;
  Target *this_local;
  CompileData *fd;
  
  local_21 = 0;
  local_20 = sf;
  sf_local = (cmSourceFile *)this;
  this_local = (Target *)__return_storage_ptr__;
  CompileData::CompileData(__return_storage_ptr__);
  cmSourceFile::GetLanguage_abi_cxx11_(&local_48,local_20);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
             ::at(&this->CompileDataMap,&__return_storage_ptr__->Language);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Sysroot,(string *)&pmVar4->Sysroot);
    localGenerator = cmGeneratorTarget::GetLocalGenerator(this->GT);
    genexInterpreter.Language.field_2._8_8_ = localGenerator;
    std::__cxx11::string::string((string *)&local_f0,(string *)this->Config);
    headTarget = this->GT;
    std::__cxx11::string::string
              ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
    cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)local_d0,localGenerator,&local_f0,headTarget,
               (string *)((long)&COMPILE_FLAGS.field_2 + 8));
    std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&__return_storage_ptr__->Flags,&pmVar4->Flags);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_130,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&cflags + 7));
    flags.field_2._8_8_ = cmSourceFile::GetProperty(local_20,(string *)local_130);
    if ((char *)flags.field_2._8_8_ != (char *)0x0) {
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_d0,(char *)flags.field_2._8_8_,
                          (string *)local_130);
      std::__cxx11::string::string((string *)local_160,(string *)psVar5);
      COMPILE_OPTIONS.field_2._8_8_ = 0;
      this_00 = (cmListFileBacktrace *)((long)&COMPILE_OPTIONS.field_2 + 8);
      cmListFileBacktrace::cmListFileBacktrace(this_00);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string,cmListFileBacktrace>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &__return_storage_ptr__->Flags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 this_00);
      cmListFileBacktrace::~cmListFileBacktrace
                ((cmListFileBacktrace *)((long)&COMPILE_OPTIONS.field_2 + 8));
      std::__cxx11::string::~string((string *)local_160);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"COMPILE_OPTIONS",(allocator<char> *)((long)&coptions + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&coptions + 7));
    flags_1.field_2._8_8_ = cmSourceFile::GetProperty(local_20,(string *)local_198);
    if ((char *)flags_1.field_2._8_8_ != (char *)0x0) {
      std::__cxx11::string::string((string *)local_1c8);
      uVar1 = genexInterpreter.Language.field_2._8_8_;
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_d0,(char *)flags_1.field_2._8_8_
                          ,(string *)local_198);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)uVar1,(string *)local_1c8,psVar5,(char *)0x0);
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = &includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)this_01);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string,cmListFileBacktrace>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &__return_storage_ptr__->Flags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 (cmListFileBacktrace *)this_01);
      cmListFileBacktrace::~cmListFileBacktrace
                ((cmListFileBacktrace *)
                 &includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"INCLUDE_DIRECTORIES",(allocator<char> *)((long)&cincludes + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&cincludes + 7));
    expression = cmSourceFile::GetProperty(local_20,(string *)local_210);
    if (expression != (char *)0x0) {
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_d0,expression,
                          (string *)local_210);
      cmLocalGenerator::AppendIncludeDirectories
                ((cmLocalGenerator *)genexInterpreter.Language.field_2._8_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&INCLUDE_DIRECTORIES.field_2 + 8),psVar5,local_20);
      this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&INCLUDE_DIRECTORIES.field_2 + 8);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_02);
      include = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_02);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&include), bVar2) {
        pbStack_248 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
        local_249 = cmGeneratorTarget::IsSystemIncludeDirectory
                              (this->GT,pbStack_248,this->Config,&__return_storage_ptr__->Language);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::emplace_back<std::__cxx11::string_const&,bool_const&>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&__return_storage_ptr__->Includes,pbStack_248,&local_249);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::__cxx11::string::~string((string *)local_210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
    local_260._M_current =
         (IncludeEntry *)
         std::
         vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
         ::end(&__return_storage_ptr__->Includes);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>
    ::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry*>
              ((__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>
                *)&local_258,&local_260);
    __first = std::
              vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
              ::begin(&pmVar4->Includes);
    __last = std::
             vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             ::end(&pmVar4->Includes);
    COMPILE_DEFINITIONS.field_2._8_8_ =
         std::
         vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
         ::
         insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                   ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                     *)&__return_storage_ptr__->Includes,local_258,
                    (__normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
                     )__first._M_current,
                    (__normal_iterator<const_(anonymous_namespace)::CompileData::IncludeEntry_*,_std::vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>_>
                     )__last._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"COMPILE_DEFINITIONS",
               (allocator<char> *)
               ((long)&fileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fileDefines._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&defs);
    defPropName.field_2._8_8_ = cmSourceFile::GetProperty(local_20,(string *)local_298);
    uVar1 = genexInterpreter.Language.field_2._8_8_;
    if ((char *)defPropName.field_2._8_8_ != (char *)0x0) {
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_d0,
                          (char *)defPropName.field_2._8_8_,(string *)local_298);
      cmLocalGenerator::AppendDefines
                ((cmLocalGenerator *)uVar1,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&defs,psVar5);
    }
    cmsys::SystemTools::UpperCase((string *)&config_defs,this->Config);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                   "COMPILE_DEFINITIONS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&config_defs
                  );
    std::__cxx11::string::~string((string *)&config_defs);
    defines._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)cmSourceFile::GetProperty(local_20,(string *)local_2f8);
    uVar1 = genexInterpreter.Language.field_2._8_8_;
    if ((char *)defines._M_t._M_impl.super__Rb_tree_header._M_node_count != (char *)0x0) {
      psVar5 = cmGeneratorExpressionInterpreter::Evaluate
                         ((cmGeneratorExpressionInterpreter *)local_d0,
                          (char *)defines._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (string *)local_298);
      cmLocalGenerator::AppendDefines
                ((cmLocalGenerator *)uVar1,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&defs,psVar5);
    }
    std::
    set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_350);
    __first_00 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&defs);
    __last_00 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&defs);
    std::
    set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
    ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                *)local_350,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first_00._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last_00._M_node);
    __first_01 = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(&pmVar4->Defines);
    __last_01 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&pmVar4->Defines);
    std::
    set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
    ::
    insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
              ((set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                *)local_350,
               (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )__first_01._M_current,
               (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )__last_01._M_current);
    CompileData::SetDefines
              (__return_storage_ptr__,
               (set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_350);
    local_21 = 1;
    std::
    set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~set((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_350);
    std::__cxx11::string::~string((string *)local_2f8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&defs);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_130);
    cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)local_d0);
  }
  else {
    local_21 = 1;
  }
  if ((local_21 & 1) == 0) {
    CompileData::~CompileData(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CompileData Target::BuildCompileData(cmSourceFile* sf)
{
  CompileData fd;

  fd.Language = sf->GetLanguage();
  if (fd.Language.empty()) {
    return fd;
  }
  CompileData const& cd = this->CompileDataMap.at(fd.Language);

  fd.Sysroot = cd.Sysroot;

  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmGeneratorExpressionInterpreter genexInterpreter(lg, this->Config, this->GT,
                                                    fd.Language);

  fd.Flags = cd.Flags;
  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = sf->GetProperty(COMPILE_FLAGS)) {
    std::string flags = genexInterpreter.Evaluate(cflags, COMPILE_FLAGS);
    fd.Flags.emplace_back(std::move(flags), cmListFileBacktrace());
  }
  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = sf->GetProperty(COMPILE_OPTIONS)) {
    std::string flags;
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
    fd.Flags.emplace_back(std::move(flags), cmListFileBacktrace());
  }

  // Add include directories from source file properties.
  {
    std::vector<std::string> includes;
    const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
    if (const char* cincludes = sf->GetProperty(INCLUDE_DIRECTORIES)) {
      const std::string& evaluatedIncludes =
        genexInterpreter.Evaluate(cincludes, INCLUDE_DIRECTORIES);
      lg->AppendIncludeDirectories(includes, evaluatedIncludes, *sf);

      for (std::string const& include : includes) {
        bool const isSystemInclude = this->GT->IsSystemIncludeDirectory(
          include, this->Config, fd.Language);
        fd.Includes.emplace_back(include, isSystemInclude);
      }
    }
  }
  fd.Includes.insert(fd.Includes.end(), cd.Includes.begin(),
                     cd.Includes.end());

  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  std::set<std::string> fileDefines;
  if (const char* defs = sf->GetProperty(COMPILE_DEFINITIONS)) {
    lg->AppendDefines(fileDefines,
                      genexInterpreter.Evaluate(defs, COMPILE_DEFINITIONS));
  }

  const std::string defPropName =
    "COMPILE_DEFINITIONS_" + cmSystemTools::UpperCase(this->Config);
  if (const char* config_defs = sf->GetProperty(defPropName)) {
    lg->AppendDefines(
      fileDefines,
      genexInterpreter.Evaluate(config_defs, COMPILE_DEFINITIONS));
  }

  std::set<BT<std::string>> defines;
  defines.insert(fileDefines.begin(), fileDefines.end());
  defines.insert(cd.Defines.begin(), cd.Defines.end());

  fd.SetDefines(defines);

  return fd;
}